

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateChangePerfTestCases.cpp
# Opt level: O0

void __thiscall
deqp::gls::StateChangePerformanceCase::requireSamplers(StateChangePerformanceCase *this,int count)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  size_type sVar2;
  value_type_conflict2 local_24;
  long lStack_20;
  GLuint sampler;
  Functions *gl;
  StateChangePerformanceCase *pSStack_10;
  int count_local;
  StateChangePerformanceCase *this_local;
  
  gl._4_4_ = count;
  pSStack_10 = this;
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar1);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_samplers);
  if ((int)sVar2 < gl._4_4_) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (&this->m_samplers,(long)gl._4_4_);
    while (sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_samplers)
          , (int)sVar2 < gl._4_4_) {
      (**(code **)(lStack_20 + 0x6f0))(1,&local_24);
      err = (**(code **)(lStack_20 + 0x800))();
      glu::checkError(err,"glGenSamplers()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x1c8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->m_samplers,&local_24);
    }
  }
  return;
}

Assistant:

void StateChangePerformanceCase::requireSamplers (int count)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	if ((int)m_samplers.size() >= count)
		return;

	m_samplers.reserve(count);

	while ((int)m_samplers.size() < count)
	{
		GLuint sampler;
		gl.genSamplers(1, &sampler);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenSamplers()");
		m_samplers.push_back(sampler);
	}
}